

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O3

void sptk::world::histc(double *x,int x_length,double *edges,int edges_length,int *index)

{
  double dVar1;
  double dVar2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  double dVar3;
  uint uVar8;
  
  iVar7 = 0;
  uVar11 = 0;
  if (edges_length < 1) {
LAB_001268c8:
    uVar10 = (uint)uVar11;
    if ((int)uVar10 < edges_length) {
      uVar9 = 1;
      do {
        iVar7 = (int)uVar11;
        dVar1 = x[uVar9];
        dVar2 = edges[iVar7];
        dVar3 = edges[iVar7];
        index[iVar7] = uVar9;
        uVar10 = (uint)(dVar1 < dVar3 || dVar1 == dVar2);
        uVar9 = uVar9 + uVar10;
        uVar10 = iVar7 - uVar10;
        uVar8 = x_length;
        if (uVar9 == x_length) break;
        uVar10 = uVar10 + 1;
        uVar11 = (ulong)uVar10;
        uVar8 = uVar9;
      } while ((int)uVar10 < edges_length);
      iVar7 = uVar8 - 1;
    }
  }
  else {
    dVar1 = *x;
    uVar11 = 0;
    do {
      index[uVar11] = 1;
      if (dVar1 <= edges[uVar11]) goto LAB_001268c8;
      uVar11 = uVar11 + 1;
    } while ((uint)edges_length != uVar11);
    iVar7 = 0;
    uVar10 = edges_length;
  }
  auVar6 = _DAT_0012bf60;
  auVar5 = _DAT_0012bcc0;
  auVar4 = _DAT_0012bcb0;
  if ((int)(uVar10 + 1) < edges_length) {
    uVar9 = (edges_length - uVar10) - 2;
    auVar12._4_4_ = 0;
    auVar12._0_4_ = uVar9;
    auVar12._8_4_ = uVar9;
    auVar12._12_4_ = 0;
    uVar11 = 0;
    auVar12 = auVar12 ^ _DAT_0012bcc0;
    do {
      auVar14._8_4_ = (int)uVar11;
      auVar14._0_8_ = uVar11;
      auVar14._12_4_ = (int)(uVar11 >> 0x20);
      auVar15 = (auVar14 | auVar4) ^ auVar5;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        index[(long)(int)uVar10 + uVar11 + 1] = iVar7;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        index[(long)(int)uVar10 + uVar11 + 2] = iVar7;
      }
      auVar14 = (auVar14 | auVar6) ^ auVar5;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
        index[(long)(int)uVar10 + uVar11 + 3] = iVar7;
        index[(long)(int)uVar10 + uVar11 + 4] = iVar7;
      }
      uVar11 = uVar11 + 4;
    } while (((ulong)uVar9 + 4 & 0xfffffffffffffffc) != uVar11);
  }
  return;
}

Assistant:

void histc(const double *x, int x_length, const double *edges,
    int edges_length, int *index) {
  int count = 1;

  int i = 0;
  for (; i < edges_length; ++i) {
    index[i] = 1;
    if (edges[i] >= x[0]) break;
  }
  for (; i < edges_length; ++i) {
    if (edges[i] < x[count]) {
      index[i] = count;
    } else {
      index[i--] = count++;
    }
    if (count == x_length) break;
  }
  count--;
  for (i++; i < edges_length; ++i) index[i] = count;
}